

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeBuilder::embedLabel(CodeBuilder *this,Label *label)

{
  uint32_t uVar1;
  Error EVar2;
  CBNode *node;
  size_t sStack_18;
  
  EVar2 = (this->super_CodeEmitter)._lastError;
  if (EVar2 == 0) {
    if ((this->_cbHeap)._zone == (Zone *)0x0) {
      embedLabel();
    }
    uVar1 = (label->super_Operand).super_Operand_.field_0._any.id;
    node = (CBNode *)ZoneHeap::_alloc(&this->_cbHeap,0x30,&sStack_18);
    node->_prev = (CBNode *)0x0;
    node->_next = (CBNode *)0x0;
    node->_type = '\x05';
    node->_opCount = '\0';
    node->_flags = (uint16_t)this->_nodeFlags;
    node->_position = this->_position;
    node->_inlineComment = (char *)0x0;
    node->_passData = (void *)0x0;
    *(uint32_t *)&node[1]._prev = uVar1;
    addNode(this,node);
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

Error CodeBuilder::embedLabel(const Label& label) {
  if (_lastError) return _lastError;

  CBLabelData* node = newNodeT<CBLabelData>(label.getId());
  if (ASMJIT_UNLIKELY(!node))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  addNode(node);
  return kErrorOk;
}